

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeResume
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType ct,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *tags,
          vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *labels
          )

{
  undefined8 *puVar1;
  uintptr_t *puVar2;
  MixedArena **operands;
  MixedArena **__dest;
  HeapTypeKind HVar3;
  size_t size;
  Resume *expr;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *sentTypes;
  char *pcVar4;
  Type *pTVar5;
  char *pcVar6;
  optional<wasm::HeapType> ct_00;
  undefined1 local_1b8 [8];
  Signature contSig;
  Result<wasm::ResumeTable> resumetable;
  Resume curr;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  undefined1 local_90 [8];
  Result<wasm::ResumeTable> _val;
  HeapType ct_local;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
  super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
  super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
  super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
  super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
  super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_ = ct.id;
  if ((long)(tags->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(tags->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
            super__Vector_impl_data._M_start >> 4 ==
      (long)(labels->
            super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(labels->
            super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 3) {
    HVar3 = HeapType::getKind((HeapType *)
                              ((long)&_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                                      super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
    if (HVar3 == Cont) {
      curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements
           = (size_t)&this->wasm->allocator;
      operands = &curr.handlerBlocks.allocator;
      resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
      super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_index = ']';
      curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression._id = InvalidId;
      curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression._1_7_ = 0;
      curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression.type.id = 0;
      curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0
      ;
      curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
      curr.handlerTags.allocator = (MixedArena *)0x0;
      curr.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
           (Name *)0x0;
      curr.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0
      ;
      curr.handlerBlocks.allocator = (MixedArena *)0x0;
      curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
           = (Expression **)0x0;
      curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      curr.cont = (Expression *)0x0;
      curr.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.data = (Type *)0x0;
      curr.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.usedElements = 0;
      curr.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
      allocatedElements =
           curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
           allocatedElements;
      curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements =
           curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
           allocatedElements;
      curr.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.allocatedElements =
           curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
           allocatedElements;
      contSig.results.id =
           (uintptr_t)
           HeapType::getContinuation
                     ((HeapType *)
                      ((long)&_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                              super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                              super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                              super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
      _local_1b8 = HeapType::getSignature((HeapType *)&contSig.results);
      size = wasm::Type::size((Type *)local_1b8);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)operands,
                 size);
      local_b8._8_8_ = 0;
      pcStack_a0 = std::
                   _Function_handler<wasm::Result<wasm::Type>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2433:5)>
                   ::_M_invoke;
      local_a8 = std::
                 _Function_handler<wasm::Result<wasm::Type>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2433:5)>
                 ::_M_manager;
      curr.sentTypes.allocator = (MixedArena *)this;
      local_b8._M_unused._M_object = this;
      makeResumeTable((Result<wasm::ResumeTable> *)&contSig.results,labels,
                      (function<wasm::Result<wasm::Name>_(unsigned_int)> *)&curr.sentTypes.allocator
                      ,(function<wasm::Result<wasm::Type>_(unsigned_int)> *)&local_b8);
      if (local_a8 != (code *)0x0) {
        (*local_a8)(&local_b8,&local_b8,__destroy_functor);
      }
      __dest = &curr.sentTypes.allocator;
      std::
      _Function_handler<wasm::Result<wasm::Name>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2432:5)>
      ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)local_90,
                      (_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)&contSig.results);
      if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
          super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
          super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
          super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
          super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
          super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
          _M_storage[0x28] == '\x01') {
        ct_local.id = (uintptr_t)&local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&ct_local,local_90,
                   _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                   super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._0_8_ +
                   (long)local_90);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if ((undefined1 *)ct_local.id == &local_40) {
          *puVar1 = CONCAT71(uStack_3f,local_40);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_38;
        }
        else {
          *(uintptr_t *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = ct_local.id;
          *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(uStack_3f,local_40);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_48;
        local_40 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        ct_local.id = (uintptr_t)&local_40;
        std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)local_90);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)local_90);
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload =
             (_Storage<wasm::HeapType,_true>)
             _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
             super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
             super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
             super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
             super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
             super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_;
        ct_local.id = (uintptr_t)this;
        ChildPopper::visitResume
                  ((Result<wasm::Ok> *)local_90,(ChildPopper *)&ct_local,
                   (Resume *)
                   ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30),ct_00);
        if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
            super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
            super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
            super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
            super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
            super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
            _M_storage[0x18] == '\x01') {
          ct_local.id = (uintptr_t)&local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&ct_local,local_90,
                     _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                     super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._0_8_ +
                     (long)local_90);
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_90);
          anon_unknown_283::validateTypeAnnotation
                    ((Result<wasm::Ok> *)local_90,
                     (HeapType)
                     _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                     super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_,
                     (Expression *)curr.operands.allocator);
          if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
              super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
              super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
              super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
              super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
              super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
              _M_storage[0x18] != '\x01') {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_90);
            pTVar5 = (Type *)0x0;
            if (resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
                _M_storage[0x28] == '\0') {
              pTVar5 = &contSig.results;
            }
            sentTypes = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)0x18;
            if (resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
                _M_storage[0x28] == '\0') {
              sentTypes = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                          ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                                  super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x10);
            }
            expr = Builder::makeResume(&this->builder,tags,
                                       (vector<wasm::Name,_std::allocator<wasm::Name>_> *)pTVar5,
                                       sentTypes,(ExpressionList *)operands,
                                       (Expression *)curr.operands.allocator);
            push(this,(Expression *)expr);
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
            goto LAB_00ca1741;
          }
          ct_local.id = (uintptr_t)&local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&ct_local,local_90,
                     _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                     super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._0_8_ +
                     (long)local_90);
        }
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if ((undefined1 *)ct_local.id == &local_40) {
          *puVar1 = CONCAT71(uStack_3f,local_40);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_38;
        }
        else {
          *(uintptr_t *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = ct_local.id;
          *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(uStack_3f,local_40);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_48;
        local_40 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        ct_local.id = (uintptr_t)&local_40;
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_90);
      }
LAB_00ca1741:
      std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)&contSig.results);
      return __return_storage_ptr__;
    }
    pcVar6 = "expected continuation type";
    pcVar4 = "";
  }
  else {
    pcVar6 = "the sizes of tags and labels must be equal";
    pcVar4 = "";
  }
  pTVar5 = &curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression.type;
  resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
  super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
  super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
  super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
  super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
  super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_ = pTVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                     super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30),pcVar6,pcVar4);
  puVar2 = (uintptr_t *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
  *(uintptr_t **)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
  if ((Type *)resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
              super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
              super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
              super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
              super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
              super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_ == pTVar5) {
    *puVar2 = curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression.type.id;
    *(Name **)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
         curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
  }
  else {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
         resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
         super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
         super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
         super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
         super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
         super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_;
    *(uintptr_t *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
         curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression.type.id;
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
       curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression._0_8_;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
  return __return_storage_ptr__;
}

Assistant:

Result<>
IRBuilder::makeResume(HeapType ct,
                      const std::vector<Name>& tags,
                      const std::vector<std::optional<Index>>& labels) {
  if (tags.size() != labels.size()) {
    return Err{"the sizes of tags and labels must be equal"};
  }
  if (!ct.isContinuation()) {
    return Err{"expected continuation type"};
  }

  Resume curr(wasm.allocator);
  auto contSig = ct.getContinuation().type.getSignature();
  curr.operands.resize(contSig.params.size());

  Result<ResumeTable> resumetable = makeResumeTable(
    labels,
    [this](Index i) { return this->getLabelName(i); },
    [this](Index i) { return this->getLabelType(i); });
  CHECK_ERR(resumetable);
  CHECK_ERR(ChildPopper{*this}.visitResume(&curr, ct));
  CHECK_ERR(validateTypeAnnotation(ct, curr.cont));

  push(builder.makeResume(tags,
                          resumetable->targets,
                          resumetable->sentTypes,
                          std::move(curr.operands),
                          curr.cont));

  return Ok{};
}